

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O1

void __thiscall ABasicArmor::Serialize(ABasicArmor *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  AInventory::Serialize((AInventory *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->SavePercent);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->BonusCount);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->MaxAbsorb);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->MaxFullAbsorb);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&(this->super_AArmor).super_AInventory.field_0x4dc);
  pFVar1 = FArchive::operator<<(pFVar1,&(this->ArmorType).super_FName);
  FArchive::operator<<(pFVar1,(DWORD *)&this->ActualSaveAmount);
  return;
}

Assistant:

void ABasicArmor::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << SavePercent << BonusCount << MaxAbsorb << MaxFullAbsorb << AbsorbCount << ArmorType << ActualSaveAmount;
}